

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::ClearNodeVector
          (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this)

{
  Node *block;
  long lVar1;
  hash_t i;
  ulong uVar2;
  
  lVar1 = 8;
  for (uVar2 = 0; block = this->Nodes, uVar2 < this->Size; uVar2 = uVar2 + 1) {
    if (*(long *)((long)block + lVar1 + -8) != 1) {
      FString::~FString((FString *)((long)&block->Next + lVar1));
    }
    lVar1 = lVar1 + 0x18;
  }
  M_Free(block);
  this->Nodes = (Node *)0x0;
  this->LastFree = (Node *)0x0;
  this->Size = 0;
  this->NumUsed = 0;
  return;
}

Assistant:

void ClearNodeVector()
	{
		for (hash_t i = 0; i < Size; ++i)
		{
			if (!Nodes[i].IsNil())
			{
				Nodes[i].~Node();
			}
		}
		M_Free(Nodes);
		Nodes = NULL;
		Size = 0;
		LastFree = NULL;
		NumUsed = 0;
	}